

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::__fastunpack4(uint8_t *in,uint8_t *out)

{
  byte bVar1;
  uint8_t outer;
  int iVar2;
  
  outer = '\0';
  do {
    bVar1 = *in;
    iVar2 = 0;
    do {
      *out = bVar1 >> ((byte)iVar2 & 0x1f) & 0xf;
      out = out + 1;
      iVar2 = iVar2 + 4;
    } while (iVar2 == 4);
    in = in + 1;
    outer = outer + '\x01';
  } while (outer != '\x04');
  return;
}

Assistant:

void __fastunpack4(const uint8_t *__restrict in, uint8_t *__restrict out) {
	for (uint8_t outer = 0; outer < 4; ++outer) {
		for (uint8_t inwordpointer = 0; inwordpointer < 8; inwordpointer += 4)
			*(out++) = ((*in) >> inwordpointer) % (1U << 4);
		++in;
	}
}